

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_views.cpp
# Opt level: O3

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DefaultViewGenerator::CreateDefaultEntry
          (DefaultViewGenerator *this,ClientContext *context,string *entry_name)

{
  Catalog *args;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *args_1;
  char *__s;
  char *pcVar1;
  int iVar2;
  type args_2;
  CreateViewInfo *this_00;
  pointer pCVar3;
  string *in_RCX;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> this_01;
  pointer *__ptr;
  long lVar4;
  string name;
  string schema;
  _Head_base<0UL,_duckdb::CreateViewInfo_*,_false> local_98;
  undefined1 local_90 [8];
  _Head_base<0UL,_duckdb::CreateViewInfo_*,_false> local_88;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_80;
  ClientContext *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  char local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  char local_40 [16];
  
  local_80._M_head_impl = (CatalogEntry *)this;
  local_78 = (ClientContext *)entry_name;
  StringUtil::Lower((string *)&local_50,
                    (string *)
                    ((context->db).internal.
                     super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 2));
  StringUtil::Lower((string *)&local_70,in_RCX);
  lVar4 = 0x10;
  do {
    iVar2 = ::std::__cxx11::string::compare(local_50._M_local_buf);
    if (iVar2 == 0) {
      iVar2 = ::std::__cxx11::string::compare(local_70._M_local_buf);
      if (iVar2 == 0) {
        this_00 = (CreateViewInfo *)operator_new(0x1b0);
        CreateViewInfo::CreateViewInfo(this_00);
        local_98._M_head_impl = this_00;
        pCVar3 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                               *)&local_98);
        ::std::__cxx11::string::_M_assign((string *)&(pCVar3->super_CreateInfo).schema);
        pCVar3 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                               *)&local_98);
        ::std::__cxx11::string::_M_assign((string *)&pCVar3->view_name);
        __s = *(char **)((long)&internal_views + lVar4);
        pCVar3 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                               *)&local_98);
        pcVar1 = (char *)(pCVar3->super_CreateInfo).sql._M_string_length;
        strlen(__s);
        ::std::__cxx11::string::_M_replace
                  ((ulong)&(pCVar3->super_CreateInfo).sql,0,pcVar1,(ulong)__s);
        pCVar3 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                               *)&local_98);
        (pCVar3->super_CreateInfo).temporary = true;
        pCVar3 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                               *)&local_98);
        (pCVar3->super_CreateInfo).internal = true;
        local_88._M_head_impl = local_98._M_head_impl;
        local_98._M_head_impl = (CreateViewInfo *)0x0;
        CreateViewInfo::FromSelect
                  ((CreateViewInfo *)local_90,local_78,
                   (unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                    *)&local_88);
        this_01._M_head_impl = local_80._M_head_impl;
        if (local_88._M_head_impl != (CreateViewInfo *)0x0) {
          (*((local_88._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
        }
        local_88._M_head_impl = (CreateViewInfo *)0x0;
        if (local_98._M_head_impl != (CreateViewInfo *)0x0) {
          (*((local_98._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
        }
        goto LAB_01575997;
      }
    }
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x460);
  local_90 = (undefined1  [8])0x0;
  this_01._M_head_impl = local_80._M_head_impl;
LAB_01575997:
  if ((char *)local_70._M_allocated_capacity != local_60) {
    operator_delete((void *)local_70._M_allocated_capacity);
  }
  if ((char *)local_50._M_allocated_capacity != local_40) {
    operator_delete((void *)local_50._M_allocated_capacity);
  }
  if ((_Tuple_impl<0UL,_duckdb::CreateViewInfo_*,_std::default_delete<duckdb::CreateViewInfo>_>)
      local_90 == (CreateViewInfo *)0x0) {
    (this_01._M_head_impl)->_vptr_CatalogEntry = (_func_int **)0x0;
  }
  else {
    args = (Catalog *)
           (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    args_1 = (context->db).internal.
             super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    args_2 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
             operator*((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                        *)local_90);
    make_uniq_base<duckdb::CatalogEntry,duckdb::ViewCatalogEntry,duckdb::Catalog&,duckdb::SchemaCatalogEntry&,duckdb::CreateViewInfo&>
              ((duckdb *)this_01._M_head_impl,args,(SchemaCatalogEntry *)args_1,args_2);
    if (local_90 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_90 + 8))();
    }
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (__uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         this_01._M_head_impl;
}

Assistant:

unique_ptr<CatalogEntry> DefaultViewGenerator::CreateDefaultEntry(ClientContext &context, const string &entry_name) {
	auto info = GetDefaultView(context, schema.name, entry_name);
	if (info) {
		return make_uniq_base<CatalogEntry, ViewCatalogEntry>(catalog, schema, *info);
	}
	return nullptr;
}